

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTContext.h
# Opt level: O2

void __thiscall
slang::ast::AssertionInstanceDetails::AssertionInstanceDetails(AssertionInstanceDetails *this)

{
  this->symbol = (Symbol *)0x0;
  this->prevContext = (ASTContext *)0x0;
  this->instanceLoc = (SourceLocation)0x0;
  boost::unordered::
  unordered_flat_map<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
  ::unordered_flat_map(&this->argumentMap);
  boost::unordered::
  unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>
  ::unordered_flat_map(&this->localVars);
  this->argExpansionLoc = (SourceLocation)0x0;
  this->argDetails = (AssertionInstanceDetails *)0x0;
  this->isRecursive = false;
  return;
}

Assistant:

struct SLANG_EXPORT AssertionInstanceDetails {
    /// The assertion member being instantiated.
    const Symbol* symbol = nullptr;

    /// The previous AST context used to start the instantiation.
    /// This effectively forms a linked list when expanding a nested
    /// stack of sequence and property instances.
    const ASTContext* prevContext = nullptr;

    /// The location where the instance is being instantiated.
    SourceLocation instanceLoc;

    /// A map of formal argument symbols to their actual replacements.
    flat_hash_map<const Symbol*, std::tuple<const syntax::PropertyExprSyntax*, ASTContext>>
        argumentMap;

    /// A map of local variables declared in the assertion item.
    /// These don't exist in any scope because their types can depend
    /// on the expanded arguments.
    flat_hash_map<std::string_view, const Symbol*> localVars;

    /// If an argument to a sequence or property is being expanded, this
    /// member contains the source location where the argument was referenced.
    SourceLocation argExpansionLoc;

    /// If an argument is being expanded, this is the context in which the
    /// argument was originally being created (as opposed to where it is being
    /// expanded now).
    const AssertionInstanceDetails* argDetails = nullptr;

    /// Indicates whether this particular instance has already been seen
    /// previously in the stack of assertion instances being expanded.
    /// Only applicable to properties, since this is illegal for sequences.
    bool isRecursive = false;
}